

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O3

gnode_t * gnode_list_expr_create
                    (gtoken_s token,gnode_r *list1,gnode_r *list2,_Bool ismap,gnode_t *decl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = NODE_LIST_EXPR;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  *(_Bool *)&pgVar1[1].tag = ismap;
  *(gnode_r **)&pgVar1[1].block_length = list1;
  *(gnode_r **)&pgVar1[1].token = list2;
  return pgVar1;
}

Assistant:

gnode_t *gnode_list_expr_create (gtoken_s token, gnode_r *list1, gnode_r *list2, bool ismap, gnode_t *decl) {
    gnode_list_expr_t *node = (gnode_list_expr_t *)mem_alloc(NULL, sizeof(gnode_list_expr_t));

    SETBASE(node, NODE_LIST_EXPR, token);
    SETDECL(node, decl);
    node->ismap = ismap;
    node->list1 = list1;
    node->list2 = list2;
    return (gnode_t *)node;
}